

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_message.hpp
# Opt level: O0

void __thiscall
Catch::Capturer::captureValues<int,char_const*>
          (Capturer *this,size_t index,int *value,char **values)

{
  string local_48;
  char **local_28;
  char **values_local;
  int *value_local;
  size_t index_local;
  Capturer *this_local;
  
  local_28 = values;
  values_local = (char **)value;
  value_local = (int *)index;
  index_local = (size_t)this;
  Detail::stringify<int>(&local_48,value);
  captureValue(this,index,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  captureValues<char_const*>(this,(long)value_local + 1,local_28);
  return;
}

Assistant:

void captureValues( size_t index, T const& value, Ts const&... values ) {
            captureValue( index, Catch::Detail::stringify(value) );
            captureValues( index+1, values... );
        }